

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

undefined4 __thiscall
testing::Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::Perform
          (Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  undefined4 uVar2;
  ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pAVar3;
  undefined8 in_RSI;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffffa4;
  int line;
  allocator<char> *file;
  undefined1 in_stack_ffffffffffffffb7;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = IsDoDefault((Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)0x1cef0c);
  line = CONCAT13(!bVar1,(int3)in_stack_ffffffffffffffa4);
  file = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  internal::Assert((bool)in_stack_ffffffffffffffb7,(char *)file,line,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pAVar3 = internal::
           linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>
           ::operator->((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>
                         *)in_RDI);
  uVar2 = (**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,in_RSI);
  return uVar2;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }